

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O3

Boxed_Value __thiscall chaiscript::const_var(chaiscript *this,bool b)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  Boxed_Value BVar3;
  bool local_1a;
  bool local_19;
  
  if (const_var(bool)::t == '\0') {
    iVar1 = __cxa_guard_acquire(&const_var(bool)::t);
    in_RDX._M_pi = extraout_RDX;
    if (iVar1 != 0) {
      local_19 = true;
      detail::const_var_impl<bool>((detail *)&const_var::t,&local_19);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&const_var::t,&__dso_handle);
      __cxa_guard_release(&const_var(bool)::t);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  if (const_var(bool)::f == '\0') {
    iVar1 = __cxa_guard_acquire(&const_var(bool)::f);
    in_RDX._M_pi = extraout_RDX_01;
    if (iVar1 != 0) {
      local_1a = false;
      detail::const_var_impl<bool>((detail *)&const_var::f,&local_1a);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&const_var::f,&__dso_handle);
      __cxa_guard_release(&const_var(bool)::f);
      in_RDX._M_pi = extraout_RDX_02;
    }
  }
  if (b) {
    *(element_type **)this =
         const_var::t.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var2 = const_var::t.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  }
  else {
    *(element_type **)this =
         const_var::f.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var2 = const_var::f.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    }
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Boxed_Value const_var(bool b) {
    static const auto t = detail::const_var_impl(true);
    static const auto f = detail::const_var_impl(false);

    if (b) {
      return t;
    } else {
      return f;
    }
  }